

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::generateCommandVoid1Return
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,bool definition,size_t returnParam,
          bool raii)

{
  vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_> *params;
  pointer __n;
  pointer pPVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_02;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_03;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_04;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_05;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_00;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_01;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_02;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_03;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_04;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_05;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_06;
  bool bVar2;
  int iVar3;
  undefined4 uVar4;
  undefined7 in_register_00000089;
  initializer_list<unsigned_long> __l;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_00;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_01;
  initializer_list<unsigned_long> __l_02;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_03;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_04;
  initializer_list<unsigned_long> __l_05;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_06;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_07;
  initializer_list<unsigned_long> __l_08;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_09;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_10;
  initializer_list<unsigned_long> __l_11;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_12;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_13;
  initializer_list<unsigned_long> __l_14;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_15;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_16;
  initializer_list<unsigned_long> __l_17;
  undefined8 uVar5;
  size_t in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd40;
  allocator_type local_2bb;
  Flags<CommandFlavourFlagBits> local_2ba;
  allocator_type local_2b9;
  Flags<CommandFlavourFlagBits> in_stack_fffffffffffffd48;
  Flags<CommandFlavourFlagBits> FVar6;
  undefined1 in_stack_fffffffffffffd49;
  undefined1 uVar7;
  undefined2 in_stack_fffffffffffffd4a;
  undefined2 uVar8;
  pointer in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd58;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
  *in_stack_fffffffffffffd60;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
  flavourFlags;
  size_t local_260;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_228;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_210;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_198;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_180;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_150;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_120;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_f0;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_c0;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_90;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_60;
  
  uVar4 = (undefined4)CONCAT71(in_register_00000089,definition);
  params = &commandData->params;
  determineVectorParams(&vectorParams,this,params);
  iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&(commandData->params).
                      super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                      ._M_impl.super__Vector_impl_data._M_start[returnParam].type.type,"void");
  if (iVar3 == 0) {
    if (vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      if ((vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) &&
         (*(size_t *)(vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1) ==
          returnParam)) {
        stripPluralS((string *)&flavourFlags,this,name);
        __n = (pointer)name->_M_string_length;
        if (__n == flavourFlags.
                   super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
          if (__n == (pointer)0x0) {
            bVar2 = true;
          }
          else {
            iVar3 = bcmp((name->_M_dataplus)._M_p,
                         flavourFlags.
                         super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,(size_t)__n);
            bVar2 = iVar3 == 0;
          }
        }
        else {
          bVar2 = false;
        }
        if (flavourFlags.
            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&flavourFlags.
                      super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(flavourFlags.
                          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (ulong)(flavourFlags.
                                  super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
        }
        if (bVar2) {
          flavourFlags.
          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          flavourFlags.
          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          flavourFlags.
          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          iVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(name,"vkGetDescriptorEXT");
          if (iVar3 == 0) {
            std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>
            ::emplace_back<Flags<CommandFlavourFlagBits>>
                      ((vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>
                        *)&flavourFlags,(Flags<CommandFlavourFlagBits> *)&stack0xfffffffffffffd50);
          }
          std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>::
          emplace_back<Flags<CommandFlavourFlagBits>>
                    ((vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>
                      *)&flavourFlags,(Flags<CommandFlavourFlagBits> *)&stack0xfffffffffffffd50);
          __l_17._M_len = 1;
          __l_17._M_array = (iterator)&stack0xfffffffffffffd50;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_1b0,__l_17,(allocator_type *)&local_260);
          FVar6.m_mask = (MaskType)returnParam;
          uVar5 = 0x16e07f;
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::_Rb_tree(&local_60,&vectorParams._M_t);
          returnParams_05.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)&local_60;
          returnParams_05.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&local_1b0;
          returnParams_05.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vectorParams_06._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)&flavourFlags;
          vectorParams_06._M_t._M_impl._0_24_ =
               ZEXT924(CONCAT18(raii,(vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>
                                      *)&flavourFlags));
          vectorParams_06._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar5;
          vectorParams_06._M_t._M_impl.super__Rb_tree_header._M_node_count =
               in_stack_fffffffffffffd38;
          generateCommandSetInclusive
                    (__return_storage_ptr__,this,name,commandData,initialSkipCount,SUB41(uVar4,0),
                     returnParams_05,vectorParams_06,(bool)in_stack_fffffffffffffd40,
                     (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      *)CONCAT44(uVar4,CONCAT22(in_stack_fffffffffffffd4a,
                                                CONCAT11(in_stack_fffffffffffffd49,
                                                         in_stack_fffffffffffffd48.m_mask))),
                     (bool)FVar6.m_mask,(bool)in_stack_fffffffffffffd58,in_stack_fffffffffffffd60);
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::~_Rb_tree(&local_60);
          local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)flavourFlags.
                        super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)flavourFlags.
                        super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (local_1b0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1b0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_1b0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1b0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
            local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)flavourFlags.
                          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)flavourFlags.
                          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
          }
          goto joined_r0x0016e0ed;
        }
      }
LAB_0016e0f9:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      goto LAB_0016e112;
    }
    local_260 = returnParam;
    __l_08._M_len = 1;
    __l_08._M_array = &local_260;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_198,__l_08,(allocator_type *)&stack0xfffffffffffffd4a);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
    ::_Rb_tree(&local_90,&vectorParams._M_t);
    FVar6.m_mask = '\x01';
    __l_09._M_len = 1;
    __l_09._M_array = (iterator)&stack0xfffffffffffffd48;
    std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
    vector(&flavourFlags,__l_09,&local_2b9);
    local_2ba.m_mask = '\x01';
    uVar5 = 0x16dc20;
    __l_10._M_len = 1;
    __l_10._M_array = &local_2ba;
    std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
    vector((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_> *
           )&stack0xfffffffffffffd50,__l_10,&local_2bb);
    returnParams_02.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&local_90;
    returnParams_02.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_198;
    returnParams_02.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vectorParams_03._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)&stack0xfffffffffffffd50;
    vectorParams_03._M_t._M_impl._0_24_ = ZEXT924(CONCAT18(raii,&flavourFlags));
    vectorParams_03._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar5;
    vectorParams_03._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffffd38;
    generateCommandSetInclusive
              (__return_storage_ptr__,this,name,commandData,initialSkipCount,SUB41(uVar4,0),
               returnParams_02,vectorParams_03,(bool)in_stack_fffffffffffffd40,
               (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                *)CONCAT44(uVar4,CONCAT22(in_stack_fffffffffffffd4a,
                                          CONCAT11(in_stack_fffffffffffffd49,FVar6.m_mask))),
               (bool)(MaskType)in_stack_fffffffffffffd50,(bool)in_stack_fffffffffffffd58,
               in_stack_fffffffffffffd60);
    if (in_stack_fffffffffffffd50 != (pointer)0x0) {
      operator_delete(in_stack_fffffffffffffd50,
                      (long)in_stack_fffffffffffffd60 - (long)in_stack_fffffffffffffd50);
    }
    if (flavourFlags.
        super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(flavourFlags.
                      super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)flavourFlags.
                            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)flavourFlags.
                            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
    ::~_Rb_tree(&local_90);
  }
  else {
    bVar2 = isHandleType(this,&(params->
                               super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                               )._M_impl.super__Vector_impl_data._M_start[returnParam].type.type);
    if (bVar2) {
      if (vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) goto LAB_0016e0f9;
      local_260 = returnParam;
      __l._M_len = 1;
      __l._M_array = &local_260;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_1c8,__l,(allocator_type *)&stack0xfffffffffffffd4a);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
      ::_Rb_tree(&local_c0,&vectorParams._M_t);
      FVar6.m_mask = '\x01';
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&stack0xfffffffffffffd48;
      std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
      vector(&flavourFlags,__l_00,&local_2b9);
      local_2ba.m_mask = '\x01';
      uVar5 = 0x16d843;
      __l_01._M_len = 1;
      __l_01._M_array = &local_2ba;
      std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
      vector((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              *)&stack0xfffffffffffffd50,__l_01,&local_2bb);
      returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&local_c0;
      returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&local_1c8;
      returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = raii;
      vectorParams_00._M_t._M_impl._0_8_ = &flavourFlags;
      vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_header._1_7_ = 0;
      vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x1;
      vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)&stack0xfffffffffffffd50;
      vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar5;
      vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffffd38;
      generateCommandSetInclusive
                (__return_storage_ptr__,this,name,commandData,initialSkipCount,SUB41(uVar4,0),
                 returnParams,vectorParams_00,(bool)in_stack_fffffffffffffd40,
                 (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                  *)CONCAT44(uVar4,CONCAT22(in_stack_fffffffffffffd4a,
                                            CONCAT11(in_stack_fffffffffffffd49,FVar6.m_mask))),
                 (bool)(MaskType)in_stack_fffffffffffffd50,(bool)in_stack_fffffffffffffd58,
                 in_stack_fffffffffffffd60);
      if (in_stack_fffffffffffffd50 != (pointer)0x0) {
        operator_delete(in_stack_fffffffffffffd50,
                        (long)in_stack_fffffffffffffd60 - (long)in_stack_fffffffffffffd50);
      }
      if (flavourFlags.
          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(flavourFlags.
                        super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)flavourFlags.
                              super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)flavourFlags.
                              super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
      ::~_Rb_tree(&local_c0);
      local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
    }
    else {
      bVar2 = isStructureChainAnchor
                        (this,&(params->
                               super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                               )._M_impl.super__Vector_impl_data._M_start[returnParam].type.type);
      if (bVar2) {
        if (vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) goto LAB_0016e0f9;
        local_260 = returnParam;
        __l_02._M_len = 1;
        __l_02._M_array = &local_260;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_1e0,__l_02,(allocator_type *)&local_2b9);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
        ::_Rb_tree(&local_f0,&vectorParams._M_t);
        uVar8 = 0x201;
        __l_03._M_len = 2;
        __l_03._M_array = (iterator)&stack0xfffffffffffffd4a;
        std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::vector(&flavourFlags,__l_03,(allocator_type *)&local_2ba);
        FVar6.m_mask = '\x01';
        uVar7 = 2;
        uVar5 = 0x16d9f1;
        __l_04._M_len = 2;
        __l_04._M_array = (iterator)&stack0xfffffffffffffd48;
        std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::vector((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                  *)&stack0xfffffffffffffd50,__l_04,&local_2bb);
        returnParams_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&local_f0;
        returnParams_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&local_1e0;
        returnParams_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)&stack0xfffffffffffffd50;
        vectorParams_01._M_t._M_impl._0_24_ = ZEXT924(CONCAT18(raii,&flavourFlags));
        vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar5;
        vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffffd38
        ;
        generateCommandSetInclusive
                  (__return_storage_ptr__,this,name,commandData,initialSkipCount,SUB41(uVar4,0),
                   returnParams_00,vectorParams_01,(bool)in_stack_fffffffffffffd40,
                   (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                    *)CONCAT44(uVar4,CONCAT22(uVar8,CONCAT11(uVar7,FVar6.m_mask))),
                   (bool)(MaskType)in_stack_fffffffffffffd50,(bool)in_stack_fffffffffffffd58,
                   in_stack_fffffffffffffd60);
        if (in_stack_fffffffffffffd50 != (pointer)0x0) {
          operator_delete(in_stack_fffffffffffffd50,
                          (long)in_stack_fffffffffffffd60 - (long)in_stack_fffffffffffffd50);
        }
        if (flavourFlags.
            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(flavourFlags.
                          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)flavourFlags.
                                super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)flavourFlags.
                                super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
        ::~_Rb_tree(&local_f0);
        local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
      }
      else if (vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
        if (*(size_t *)(vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1) ==
            returnParam) {
          local_260 = returnParam;
          __l_11._M_len = 1;
          __l_11._M_array = &local_260;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_210,__l_11,(allocator_type *)&stack0xfffffffffffffd48);
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::_Rb_tree(&local_150,&vectorParams._M_t);
          uVar8 = 0x1001;
          __l_12._M_len = 2;
          __l_12._M_array = (iterator)&stack0xfffffffffffffd4a;
          std::
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
          vector(&flavourFlags,__l_12,&local_2b9);
          local_2ba.m_mask = '\x01';
          uVar5 = 0x16dd4d;
          __l_13._M_len = 1;
          __l_13._M_array = &local_2ba;
          std::
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
          vector((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                  *)&stack0xfffffffffffffd50,__l_13,&local_2bb);
          returnParams_03.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)&local_150;
          returnParams_03.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&local_210;
          returnParams_03.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vectorParams_04._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)&stack0xfffffffffffffd50;
          vectorParams_04._M_t._M_impl._0_24_ = ZEXT924(CONCAT18(raii,&flavourFlags));
          vectorParams_04._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar5;
          vectorParams_04._M_t._M_impl.super__Rb_tree_header._M_node_count =
               in_stack_fffffffffffffd38;
          generateCommandSetInclusive
                    (__return_storage_ptr__,this,name,commandData,initialSkipCount,SUB41(uVar4,0),
                     returnParams_03,vectorParams_04,(bool)in_stack_fffffffffffffd40,
                     (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      *)CONCAT44(uVar4,CONCAT22(uVar8,CONCAT11(in_stack_fffffffffffffd49,
                                                               in_stack_fffffffffffffd48.m_mask))),
                     (bool)(MaskType)in_stack_fffffffffffffd50,(bool)in_stack_fffffffffffffd58,
                     in_stack_fffffffffffffd60);
          if (in_stack_fffffffffffffd50 != (pointer)0x0) {
            operator_delete(in_stack_fffffffffffffd50,
                            (long)in_stack_fffffffffffffd60 - (long)in_stack_fffffffffffffd50);
          }
          if (flavourFlags.
              super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(flavourFlags.
                            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)flavourFlags.
                                  super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)flavourFlags.
                                  super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::~_Rb_tree(&local_150);
          local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_210.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        }
        else {
          bVar2 = isHandleType(this,&(params->
                                     super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                     )._M_impl.super__Vector_impl_data._M_start
                                     [*(size_t *)
                                       (vectorParams._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_left + 1)].type.type);
          if ((((bVar2) ||
               (bVar2 = isStructureChainAnchor
                                  (this,&(params->
                                         super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                         )._M_impl.super__Vector_impl_data._M_start
                                         [*(long *)(vectorParams._M_t._M_impl.super__Rb_tree_header.
                                                    _M_header._M_left + 1)].type.type), bVar2)) ||
              (iVar3 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                 (&(params->
                                   super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                   )._M_impl.super__Vector_impl_data._M_start
                                   [*(long *)(vectorParams._M_t._M_impl.super__Rb_tree_header.
                                              _M_header._M_left + 1)].type.type,"void"), iVar3 == 0)
              ) || (pPVar1 = (params->
                             super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                             )._M_impl.super__Vector_impl_data._M_start,
                   bVar2 = isLenByStructMember(this,&pPVar1[*(long *)(vectorParams._M_t._M_impl.
                                                                      super__Rb_tree_header.
                                                                      _M_header._M_left + 1)].
                                                     lenExpression,
                                               pPVar1 + (long)vectorParams._M_t._M_impl.
                                                              super__Rb_tree_header._M_header.
                                                              _M_left[1]._M_parent), !bVar2))
          goto LAB_0016e0f9;
          local_260 = returnParam;
          __l_14._M_len = 1;
          __l_14._M_array = &local_260;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_228,__l_14,(allocator_type *)&stack0xfffffffffffffd4a);
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::_Rb_tree(&local_180,&vectorParams._M_t);
          FVar6.m_mask = '\x01';
          __l_15._M_len = 1;
          __l_15._M_array = (iterator)&stack0xfffffffffffffd48;
          std::
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
          vector(&flavourFlags,__l_15,&local_2b9);
          local_2ba.m_mask = '\x01';
          uVar5 = 0x16df38;
          __l_16._M_len = 1;
          __l_16._M_array = &local_2ba;
          std::
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
          vector((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                  *)&stack0xfffffffffffffd50,__l_16,&local_2bb);
          returnParams_04.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)&local_180;
          returnParams_04.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&local_228;
          returnParams_04.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vectorParams_05._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)&stack0xfffffffffffffd50;
          vectorParams_05._M_t._M_impl._0_24_ = ZEXT924(CONCAT18(raii,&flavourFlags));
          vectorParams_05._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar5;
          vectorParams_05._M_t._M_impl.super__Rb_tree_header._M_node_count =
               in_stack_fffffffffffffd38;
          generateCommandSetInclusive
                    (__return_storage_ptr__,this,name,commandData,initialSkipCount,SUB41(uVar4,0),
                     returnParams_04,vectorParams_05,(bool)in_stack_fffffffffffffd40,
                     (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      *)CONCAT44(uVar4,CONCAT22(in_stack_fffffffffffffd4a,
                                                CONCAT11(in_stack_fffffffffffffd49,FVar6.m_mask))),
                     (bool)(MaskType)in_stack_fffffffffffffd50,(bool)in_stack_fffffffffffffd58,
                     in_stack_fffffffffffffd60);
          if (in_stack_fffffffffffffd50 != (pointer)0x0) {
            operator_delete(in_stack_fffffffffffffd50,
                            (long)in_stack_fffffffffffffd60 - (long)in_stack_fffffffffffffd50);
          }
          if (flavourFlags.
              super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(flavourFlags.
                            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)flavourFlags.
                                  super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)flavourFlags.
                                  super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::~_Rb_tree(&local_180);
          local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        }
      }
      else {
        if (vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) goto LAB_0016e0f9;
        local_260 = returnParam;
        __l_05._M_len = 1;
        __l_05._M_array = &local_260;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_1f8,__l_05,(allocator_type *)&stack0xfffffffffffffd4a);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
        ::_Rb_tree(&local_120,&vectorParams._M_t);
        FVar6.m_mask = '\x01';
        __l_06._M_len = 1;
        __l_06._M_array = (iterator)&stack0xfffffffffffffd48;
        std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::vector(&flavourFlags,__l_06,&local_2b9);
        local_2ba.m_mask = '\x01';
        uVar5 = 0x16db12;
        __l_07._M_len = 1;
        __l_07._M_array = &local_2ba;
        std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::vector((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                  *)&stack0xfffffffffffffd50,__l_07,&local_2bb);
        returnParams_01.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&local_120;
        returnParams_01.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&local_1f8;
        returnParams_01.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vectorParams_02._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)&stack0xfffffffffffffd50;
        vectorParams_02._M_t._M_impl._0_24_ = ZEXT924(CONCAT18(raii,&flavourFlags));
        vectorParams_02._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar5;
        vectorParams_02._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffffd38
        ;
        generateCommandSetInclusive
                  (__return_storage_ptr__,this,name,commandData,initialSkipCount,SUB41(uVar4,0),
                   returnParams_01,vectorParams_02,(bool)in_stack_fffffffffffffd40,
                   (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                    *)CONCAT44(uVar4,CONCAT22(in_stack_fffffffffffffd4a,
                                              CONCAT11(in_stack_fffffffffffffd49,FVar6.m_mask))),
                   (bool)(MaskType)in_stack_fffffffffffffd50,(bool)in_stack_fffffffffffffd58,
                   in_stack_fffffffffffffd60);
        if (in_stack_fffffffffffffd50 != (pointer)0x0) {
          operator_delete(in_stack_fffffffffffffd50,
                          (long)in_stack_fffffffffffffd60 - (long)in_stack_fffffffffffffd50);
        }
        if (flavourFlags.
            super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(flavourFlags.
                          super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)flavourFlags.
                                super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)flavourFlags.
                                super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
        ::~_Rb_tree(&local_120);
        local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
      }
    }
  }
joined_r0x0016e0ed:
  if ((pointer)local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_198.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_0016e112:
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  ::~_Rb_tree(&vectorParams._M_t);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCommandVoid1Return(
  std::string const & name, CommandData const & commandData, size_t initialSkipCount, bool definition, size_t returnParam, bool raii ) const
{
  std::map<size_t, VectorParamData> vectorParams = determineVectorParams( commandData.params );
  if ( ( commandData.params[returnParam].type.type == "void" ) )
  {
    switch ( vectorParams.size() )
    {
      case 0:
        return generateCommandSetInclusive( name,
                                            commandData,
                                            initialSkipCount,
                                            definition,
                                            { returnParam },
                                            vectorParams,
                                            false,
                                            { CommandFlavourFlagBits::enhanced },
                                            raii,
                                            false,
                                            { CommandFlavourFlagBits::enhanced } );
      case 1:
        if ( returnParam == vectorParams.begin()->first )
        {
          if ( name == stripPluralS( name ) )
          {
            std::vector<CommandFlavourFlags> flavourFlags;
            if ( name == "vkGetDescriptorEXT" )
            {
              // special handling for this function: do not return the void*, but keep its argument as it is
              flavourFlags.push_back( CommandFlavourFlagBits::noReturn | CommandFlavourFlagBits::keepVoidPtr );
            }
            flavourFlags.push_back( CommandFlavourFlagBits::singular );
            return generateCommandSetInclusive(
              name, commandData, initialSkipCount, definition, { returnParam }, vectorParams, false, flavourFlags, raii, false, flavourFlags );
          }
        }
        break;
      default: break;
    }
  }
  else if ( isHandleType( commandData.params[returnParam].type.type ) )
  {
    if ( vectorParams.empty() )
    {
      return generateCommandSetInclusive( name,
                                          commandData,
                                          initialSkipCount,
                                          definition,
                                          { returnParam },
                                          vectorParams,
                                          false,
                                          { CommandFlavourFlagBits::enhanced },
                                          raii,
                                          true,
                                          { CommandFlavourFlagBits::enhanced } );
    }
  }
  else if ( isStructureChainAnchor( commandData.params[returnParam].type.type ) )
  {
    if ( vectorParams.empty() )
    {
      return generateCommandSetInclusive( name,
                                          commandData,
                                          initialSkipCount,
                                          definition,
                                          { returnParam },
                                          vectorParams,
                                          false,
                                          { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::chained },
                                          raii,
                                          false,
                                          { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::chained } );
    }
  }
  else
  {
    switch ( vectorParams.size() )
    {
      case 0:
        return generateCommandSetInclusive( name,
                                            commandData,
                                            initialSkipCount,
                                            definition,
                                            { returnParam },
                                            vectorParams,
                                            false,
                                            { CommandFlavourFlagBits::enhanced },
                                            raii,
                                            false,
                                            { CommandFlavourFlagBits::enhanced } );
      case 1:
        if ( returnParam == vectorParams.begin()->first )
        {
          // you get a vector of stuff, with the size being one of the parameters
          return generateCommandSetInclusive( name,
                                              commandData,
                                              initialSkipCount,
                                              definition,
                                              { returnParam },
                                              vectorParams,
                                              false,
                                              { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::withAllocator },
                                              raii,
                                              false,
                                              { CommandFlavourFlagBits::enhanced } );
        }
        else
        {
          if ( !isHandleType( commandData.params[vectorParams.begin()->first].type.type ) &&
               !isStructureChainAnchor( commandData.params[vectorParams.begin()->first].type.type ) &&
               ( commandData.params[vectorParams.begin()->first].type.type != "void" ) )
          {
            if ( isLenByStructMember( commandData.params[vectorParams.begin()->first].lenExpression,
                                      commandData.params[vectorParams.begin()->second.lenParam] ) )
            {
              return generateCommandSetInclusive( name,
                                                  commandData,
                                                  initialSkipCount,
                                                  definition,
                                                  { returnParam },
                                                  vectorParams,
                                                  false,
                                                  { CommandFlavourFlagBits::enhanced },
                                                  raii,
                                                  false,
                                                  { CommandFlavourFlagBits::enhanced } );
            }
          }
        }
        break;
      default: break;
    }
  }
  return "";
}